

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O3

void duckdb::TupleDataStructWithinCollectionScatter
               (Vector *source,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *layout,Vector *row_locations,
               Vector *heap_locations,idx_t param_8,UnifiedVectorFormat *list_data,
               vector<duckdb::TupleDataScatterFunction,_true> *child_functions)

{
  long *plVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  SelectionVector *pSVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  byte bVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  TemplatedValidityData<unsigned_char> *pTVar10;
  long lVar11;
  ulong uVar12;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  const_reference this_01;
  type pVVar13;
  const_reference pvVar14;
  const_reference pvVar15;
  long lVar16;
  ulong uVar17;
  idx_t iVar18;
  _Head_base<0UL,_unsigned_char_*,_false> _Var19;
  ulong uVar20;
  idx_t iVar21;
  long *plVar22;
  size_type __n;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true> local_70;
  ulong local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  Vector *local_48;
  TupleDataLayout *local_40;
  ulong local_38;
  
  local_48 = source;
  local_40 = layout;
  if (append_count != 0) {
    pSVar2 = list_data->sel;
    pdVar3 = list_data->data;
    pSVar4 = (source_format->unified).sel;
    pdVar5 = heap_locations->data;
    iVar18 = 0;
    do {
      iVar21 = iVar18;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar21 = (idx_t)append_sel->sel_vector[iVar18];
      }
      psVar6 = pSVar2->sel_vector;
      if (psVar6 != (sel_t *)0x0) {
        iVar21 = (idx_t)psVar6[iVar21];
      }
      puVar7 = (list_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar7 == (unsigned_long *)0x0) || ((puVar7[iVar21 >> 6] >> (iVar21 & 0x3f) & 1) != 0)) {
        uVar12 = *(ulong *)(pdVar3 + iVar21 * 0x10 + 8);
        if (uVar12 != 0) {
          _Var19._M_head_impl = *(uchar **)(pdVar5 + iVar18 * 8);
          local_70.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_70.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_60 = uVar12;
          if (_Var19._M_head_impl == (uchar *)0x0) {
            local_38 = uVar12;
            make_buffer<duckdb::TemplatedValidityData<unsigned_char>,unsigned_long&>
                      ((duckdb *)&local_58,&local_38);
            p_Var9 = p_Stack_50;
            local_70.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = local_58;
            this._M_pi = local_70.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
            local_58 = (element_type *)0x0;
            p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_70.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var9;
            if ((this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi),
               p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true>::operator->
                                (&local_70);
            _Var19._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          }
          lVar11 = (uVar12 + 7 >> 3) - 1;
          if (lVar11 != 0) {
            lVar16 = 0;
            do {
              _Var19._M_head_impl[lVar16] = 0xff;
              lVar16 = lVar16 + 1;
            } while (lVar11 != lVar16);
          }
          plVar22 = (long *)(pdVar3 + iVar21 * 0x10);
          _Var19._M_head_impl[lVar11] =
               _Var19._M_head_impl[lVar11] | -((uVar12 & 7) == 0) | ~(-1 << ((byte)uVar12 & 7));
          uVar12 = plVar22[1];
          plVar1 = (long *)(pdVar5 + iVar18 * 8);
          *plVar1 = *plVar1 + (uVar12 + 7 >> 3);
          if (uVar12 != 0) {
            uVar17 = 0;
            do {
              uVar20 = *plVar22 + uVar17;
              psVar6 = pSVar4->sel_vector;
              if (psVar6 != (sel_t *)0x0) {
                uVar20 = (ulong)psVar6[uVar20];
              }
              puVar7 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                       validity_mask;
              if ((puVar7 != (unsigned_long *)0x0) &&
                 ((puVar7[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0)) {
                bVar8 = (byte)uVar17 & 7;
                _Var19._M_head_impl[uVar17 >> 3] =
                     _Var19._M_head_impl[uVar17 >> 3] & (-2 << bVar8 | 0xfeU >> 8 - bVar8);
                uVar12 = plVar22[1];
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < uVar12);
          }
          if (local_70.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 != append_count);
  }
  this_00 = StructVector::GetEntries(local_48);
  if ((this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](this_00,__n);
      pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_01);
      pvVar14 = vector<duckdb::TupleDataVectorFormat,_true>::operator[]
                          (&source_format->children,__n);
      pvVar15 = vector<duckdb::TupleDataScatterFunction,_true>::operator[](child_functions,__n);
      (*pvVar15->function)
                (pVVar13,pvVar14,append_sel,append_count,local_40,row_locations,heap_locations,__n,
                 list_data,&pvVar15->child_functions);
      __n = __n + 1;
    } while (__n < (ulong)((long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

static void TupleDataStructWithinCollectionScatter(const Vector &source, const TupleDataVectorFormat &source_format,
                                                   const SelectionVector &append_sel, const idx_t append_count,
                                                   const TupleDataLayout &layout, const Vector &row_locations,
                                                   Vector &heap_locations, const idx_t,
                                                   const UnifiedVectorFormat &list_data,
                                                   const vector<TupleDataScatterFunction> &child_functions) {
	// Parent list data
	const auto &list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto &source_validity = source_data.validity;

	// Target
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Initialize the validity of the STRUCTs
	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue; // Original list entry is invalid - no need to serialize the child
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip the heap pointer over it
		auto &target_heap_location = target_heap_locations[i];
		ValidityBytes child_mask(target_heap_location, list_length);
		child_mask.SetAllValid(list_length);
		target_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Store the validity belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_source_idx = source_sel.get_index(list_offset + child_i);
			if (!source_validity.RowIsValid(child_source_idx)) {
				child_mask.SetInvalidUnsafe(child_i);
			}
		}
	}

	// Recurse through the children
	auto &struct_sources = StructVector::GetEntries(source);
	for (idx_t struct_col_idx = 0; struct_col_idx < struct_sources.size(); struct_col_idx++) {
		auto &struct_source = *struct_sources[struct_col_idx];
		auto &struct_format = source_format.children[struct_col_idx];
		const auto &struct_scatter_function = child_functions[struct_col_idx];
		struct_scatter_function.function(struct_source, struct_format, append_sel, append_count, layout, row_locations,
		                                 heap_locations, struct_col_idx, list_data,
		                                 struct_scatter_function.child_functions);
	}
}